

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O0

void duckdb::CreateSortKeyHelpers::DecodeSortKey
               (string_t sort_key,DataChunk *result,idx_t result_idx,
               vector<duckdb::OrderModifiers,_true> *modifiers)

{
  ulong uVar1;
  idx_t iVar2;
  DecodeSortKeyData *in_RCX;
  DecodeSortKeyVectorData *in_R8;
  DecodeSortKeyVectorData vector_data;
  value_type *vec;
  idx_t c;
  DecodeSortKeyData decode_data;
  LogicalType *in_stack_ffffffffffffff58;
  DecodeSortKeyData *in_stack_ffffffffffffff60;
  DecodeSortKeyData local_78;
  reference local_50;
  ulong local_48;
  idx_t in_stack_ffffffffffffffc8;
  Vector *in_stack_ffffffffffffffd0;
  
  DecodeSortKeyData::DecodeSortKeyData
            (in_stack_ffffffffffffff60,(string_t *)in_stack_ffffffffffffff58);
  local_48 = 0;
  while( true ) {
    uVar1 = local_48;
    iVar2 = DataChunk::ColumnCount((DataChunk *)0x13e9611);
    if (iVar2 <= uVar1) break;
    local_50 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff60,
                          (size_type)in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff58 = Vector::GetType(local_50);
    vector<duckdb::OrderModifiers,_true>::operator[]
              ((vector<duckdb::OrderModifiers,_true> *)in_stack_ffffffffffffff60,
               (size_type)in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff60 = &local_78;
    DecodeSortKeyVectorData::DecodeSortKeyVectorData
              (in_R8,(LogicalType *)in_stack_ffffffffffffffd0,SUB82((ulong)in_RCX >> 0x30,0));
    DecodeSortKeyRecursive(in_RCX,in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    DecodeSortKeyVectorData::~DecodeSortKeyVectorData((DecodeSortKeyVectorData *)0x13e96a1);
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

void CreateSortKeyHelpers::DecodeSortKey(string_t sort_key, DataChunk &result, idx_t result_idx,
                                         const vector<OrderModifiers> &modifiers) {
	DecodeSortKeyData decode_data(sort_key);
	D_ASSERT(modifiers.size() == result.ColumnCount());
	for (idx_t c = 0; c < result.ColumnCount(); c++) {
		auto &vec = result.data[c];
		DecodeSortKeyVectorData vector_data(vec.GetType(), modifiers[c]);
		DecodeSortKeyRecursive(decode_data, vector_data, vec, result_idx);
	}
}